

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLElement::DeleteAttribute(XMLElement *this,char *name)

{
  XMLAttribute *attribute;
  bool bVar1;
  char *q;
  XMLAttribute **ppXVar2;
  XMLAttribute *pXVar3;
  
  ppXVar2 = &this->_rootAttribute;
  pXVar3 = (XMLAttribute *)0x0;
  while( true ) {
    attribute = *ppXVar2;
    if (attribute == (XMLAttribute *)0x0) {
      return;
    }
    q = StrPair::GetStr(&attribute->_name);
    bVar1 = XMLUtil::StringEqual(name,q,0x7fffffff);
    if (bVar1) break;
    ppXVar2 = &attribute->_next;
    pXVar3 = attribute;
  }
  ppXVar2 = &pXVar3->_next;
  if (pXVar3 == (XMLAttribute *)0x0) {
    ppXVar2 = &this->_rootAttribute;
  }
  *ppXVar2 = attribute->_next;
  DeleteAttribute(attribute);
  return;
}

Assistant:

void XMLElement::DeleteAttribute( const char* name )
{
    XMLAttribute* prev = 0;
    for( XMLAttribute* a=_rootAttribute; a; a=a->_next ) {
        if ( XMLUtil::StringEqual( name, a->Name() ) ) {
            if ( prev ) {
                prev->_next = a->_next;
            }
            else {
                _rootAttribute = a->_next;
            }
            DeleteAttribute( a );
            break;
        }
        prev = a;
    }
}